

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleFile.cpp
# Opt level: O1

int __thiscall ModuleFile::open(ModuleFile *this,char *__file,int __oflag,...)

{
  FormatError FVar1;
  Module *this_00;
  int iVar2;
  undefined8 unaff_RBP;
  bool bVar3;
  ifstream in;
  QString local_268;
  long *local_250 [2];
  long local_240 [2];
  long local_230 [4];
  byte abStack_210 [488];
  
  QString::toUtf8_helper(&local_268);
  if (local_268.d.ptr == (char16_t *)0x0) {
    local_268.d.ptr = (char16_t *)&QByteArray::_empty;
  }
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_250,local_268.d.ptr,local_268.d.size + (long)local_268.d.ptr);
  if (&(local_268.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_268.d.d)->super_QArrayData,1,8);
    }
  }
  std::ifstream::ifstream(local_230,(string *)local_250,_S_in|_S_bin);
  if (local_250[0] != local_240) {
    operator_delete(local_250[0],local_240[0] + 1);
  }
  bVar3 = (abStack_210[*(long *)(local_230[0] + -0x18)] & 5) != 0;
  this->mIoError = bVar3;
  if (!bVar3) {
    this_00 = Module::data(___oflag);
    FVar1 = trackerboy::Module::deserialize(this_00,(istream *)local_230);
    this->mLastError = FVar1;
    this->mIoError = (abStack_210[*(long *)(local_230[0] + -0x18)] & 5) != 0;
    if (FVar1 == none) {
      updateFilename(this,(QString *)__file);
      iVar2 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      Module::reset(___oflag);
      goto LAB_0014ced3;
    }
    Module::clear(___oflag);
  }
  iVar2 = 0;
LAB_0014ced3:
  std::ifstream::~ifstream(local_230);
  return iVar2;
}

Assistant:

bool ModuleFile::open(QString const& path, Module &mod) {
    
    std::ifstream in(path.toStdString(), std::ios::binary | std::ios::in);
    mIoError = in.fail();

    if (!mIoError) {

        mLastError = mod.data().deserialize(in);
        mIoError = in.fail();
        if (mLastError == trackerboy::FormatError::none) {
            updateFilename(path);
            // emits the reset signal
            mod.reset();
            return true;
        } else {
            // failed to deserialize module but the module might be paritially loaded
            // clear it
            mod.clear();
        }
    }

    return false;
}